

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

void JX9_STDOUT_Const(jx9_value *pVal,void *pUserData)

{
  undefined8 *pUserData_00;
  jx9_stream_data *pjVar1;
  
  pUserData_00 = *(undefined8 **)((long)pUserData + 0x4d0);
  if (pUserData_00 == (undefined8 *)0x0) {
    pUserData_00 = (undefined8 *)SyMemBackendAlloc((SyMemBackend *)pUserData,0x38);
    if (pUserData_00 == (undefined8 *)0x0) {
      pUserData_00 = (undefined8 *)0x0;
    }
    else {
      *pUserData_00 = &sjx9Stream;
      pUserData_00[3] = 0;
      pUserData_00[4] = 0;
      pUserData_00[2] = pUserData;
      *(undefined4 *)(pUserData_00 + 5) = 0;
      pUserData_00[6] = 0xfeac1400000000;
      pjVar1 = JX9StreamDataInit((jx9_vm *)pUserData,2);
      pUserData_00[1] = pjVar1;
      *(undefined8 **)((long)pUserData + 0x4d0) = pUserData_00;
    }
  }
  jx9_value_resource(pVal,pUserData_00);
  return;
}

Assistant:

static void JX9_STDOUT_Const(jx9_value *pVal, void *pUserData)
{
	jx9_vm *pVm = (jx9_vm *)pUserData;
	void *pResource;
	pResource = jx9ExportStdout(pVm);
	jx9_value_resource(pVal, pResource);
}